

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::start_announcing(torrent *this)

{
  byte bVar1;
  peer_list *this_00;
  session_interface *psVar2;
  int iVar3;
  size_type sVar4;
  undefined4 extraout_var;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 in_RDX;
  char *pcVar5;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_40;
  __weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    bVar1 = this->field_0x5c0;
    if (((bVar1 & 8) != 0) ||
       ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1)) {
      if ((bVar1 & 0x40) == 0) {
        this->field_0x5c0 = bVar1 | 0x40;
        this_00 = (this->super_torrent_hot_members).m_peer_list._M_t.
                  super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                  .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        if (((this_00 == (peer_list *)0x0) ||
            (sVar4 = ::std::
                     deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             *)this_00), (int)sVar4 < 0x32)) &&
           (iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x49])(), CONCAT44(extraout_var,iVar3) != 0)) {
          psVar2 = (this->super_torrent_hot_members).m_ses;
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                     (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
          ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __weak_ptr<libtorrent::aux::torrent,void>(local_30,&local_40);
          (*(psVar2->super_session_logger)._vptr_session_logger[0x4a])(psVar2);
          ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        }
        tracker_list::reset(&this->m_trackers);
        this->m_total_failed_bytes = 0;
        this->m_total_redundant_bytes = 0;
        stat::clear(&this->m_stat);
        update_want_tick(this);
        announce_with_tracker(this,none);
        lsd_announce(this);
        return;
      }
      return;
    }
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    pcVar5 = "start_announcing(), files not checked (with valid metadata)";
  }
  else {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    pcVar5 = "start_announcing(), paused";
  }
  (*UNRECOVERED_JUMPTABLE)(this,pcVar5,in_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void torrent::start_announcing()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(state() != torrent_status::checking_files);
		if (is_paused())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_announcing(), paused");
#endif
			return;
		}
		// if we don't have metadata, we need to announce
		// before checking files, to get peers to
		// request the metadata from
		if (!m_files_checked && valid_metadata())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("start_announcing(), files not checked (with valid metadata)");
#endif
			return;
		}
		if (m_announcing) return;

		m_announcing = true;

#ifndef TORRENT_DISABLE_DHT
		if ((!m_peer_list || m_peer_list->num_peers() < 50) && m_ses.dht())
		{
			// we don't have any peers, prioritize
			// announcing this torrent with the DHT
			m_ses.prioritize_dht(shared_from_this());
		}
#endif

		// tell the tracker that we're back
		m_trackers.reset();

		// reset the stats, since from the tracker's
		// point of view, this is a new session
		m_total_failed_bytes = 0;
		m_total_redundant_bytes = 0;
		m_stat.clear();

		update_want_tick();

		announce_with_tracker();

		lsd_announce();
	}